

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZAnalyticSolution.cpp
# Opt level: O2

void __thiscall
TElasticity3DAnalytic::TElasticity3DAnalytic(TElasticity3DAnalytic *this,TElasticity3DAnalytic *cp)

{
  REAL RVar1;
  
  TPZAnalyticSolution::TPZAnalyticSolution
            (&this->super_TPZAnalyticSolution,&cp->super_TPZAnalyticSolution);
  (this->super_TPZAnalyticSolution)._vptr_TPZAnalyticSolution =
       (_func_int **)&PTR__TPZAnalyticSolution_01816540;
  *(undefined4 *)&(this->super_TPZAnalyticSolution).field_0xc =
       *(undefined4 *)&(cp->super_TPZAnalyticSolution).field_0xc;
  RVar1 = cp->fPoisson;
  this->fE = cp->fE;
  this->fPoisson = RVar1;
  std::operator<<((ostream *)&std::cout,
                  "TElasticity3DAnalytic::TElasticity3DAnalytic(const TElasticity3DAnalytic &cp): One should not invoke this copy constructor"
                 );
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZAnalyticSolution.cpp"
             ,0x2fd);
}

Assistant:

TElasticity3DAnalytic::TElasticity3DAnalytic(const TElasticity3DAnalytic &cp) : TPZAnalyticSolution(cp),fProblemType(cp.fProblemType),fE(cp.fE),fPoisson(cp.fPoisson) {
    std::cout << "TElasticity3DAnalytic::TElasticity3DAnalytic(const TElasticity3DAnalytic &cp): One should not invoke this copy constructor";
    DebugStop();
}